

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O1

Promise<kj::Maybe<capnp::MessageReaderAndFds>_> __thiscall
capnp::BufferedMessageStream::readEntireMessage
          (BufferedMessageStream *this,ArrayPtr<const_unsigned_char> prefix,
          size_t expectedSizeInWords,ArrayPtr<kj::OwnFd> fdSpace,size_t fdsSoFar,
          ReaderOptions options)

{
  long lVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  Promise<kj::AsyncCapabilityStream::ReadResult> PVar4;
  OwnPromiseNode node;
  char *pcVar5;
  unsigned_long *__dest;
  void *pvVar6;
  unsigned_long *puVar7;
  OwnFd *elementCount;
  size_t sVar8;
  size_t fdBuffer;
  TransformPromiseNodeBase *this_00;
  undefined4 in_stack_00000020;
  Promise<kj::AsyncCapabilityStream::ReadResult> promise;
  Array<capnp::word> msgBuffer;
  OwnPromiseNode intermediate;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  undefined4 uStack_64;
  size_t expectedSizeInWords_local;
  Fault f;
  _func_int **local_38;
  
  sVar8 = fdSpace.size_;
  elementCount = fdSpace.ptr;
  puVar7 = (unsigned_long *)prefix.ptr;
  _kjCondition.right = (unsigned_long *)&options.nestingLimit;
  _kjCondition.left = &expectedSizeInWords_local;
  _kjCondition.op.content.ptr = " <= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = elementCount <= (ulong)options._8_8_;
  expectedSizeInWords_local = (size_t)elementCount;
  if (elementCount > (ulong)options._8_8_) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[40]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++"
               ,0x319,FAILED,"expectedSizeInWords <= options.traversalLimitInWords",
               "_kjCondition,\"incoming RPC message exceeds size limit\"",&_kjCondition,
               (char (*) [40])"incoming RPC message exceeds size limit");
    kj::_::Debug::Fault::fatal(&f);
  }
  __dest = (unsigned_long *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  memcpy(__dest,(void *)prefix.size_,expectedSizeInWords);
  fdBuffer = (long)elementCount * 8 - expectedSizeInWords;
  tryReadWithFds((BufferedMessageStream *)&promise,puVar7,expectedSizeInWords + (long)__dest,
                 fdBuffer,(OwnFd *)fdBuffer,sVar8 * 4 + fdsSoFar);
  PVar4 = promise;
  uVar3 = options._8_8_;
  uVar2 = options.traversalLimitInWords;
  _kjCondition.op.content.size_ = (size_t)&kj::_::HeapArrayDisposer::instance;
  _kjCondition._32_8_ = fdsSoFar;
  lVar1 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
  _kjCondition.left = puVar7;
  _kjCondition.right = __dest;
  _kjCondition.op.content.ptr = (char *)elementCount;
  if (lVar1 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar1) < 0x70) {
    pvVar6 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x390);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&promise,
               kj::_::
               SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:808:13)>
               ::anon_class_80_6_c22dae31_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x390) = &PTR_destroy_006f7410;
    *(unsigned_long **)((long)pvVar6 + 0x3b0) = puVar7;
    *(unsigned_long **)((long)pvVar6 + 0x3b8) = __dest;
    *(char **)((long)pvVar6 + 0x3c0) = _kjCondition.op.content.ptr;
    *(size_t *)((long)pvVar6 + 0x3c8) = _kjCondition.op.content.size_;
    *(ulong *)((long)pvVar6 + 0x3f0) = CONCAT44(uStack_64,in_stack_00000020);
    *(size_t *)((long)pvVar6 + 0x3f8) = fdBuffer;
    *(size_t *)((long)pvVar6 + 0x3e0) = sVar8;
    *(undefined8 *)((long)pvVar6 + 1000) = uVar3;
    *(undefined8 *)((long)pvVar6 + 0x3d0) = _kjCondition._32_8_;
    *(uint64_t *)((long)pvVar6 + 0x3d8) = uVar2;
    *(void **)((long)pvVar6 + 0x398) = pvVar6;
  }
  else {
    *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
    this_00 = (TransformPromiseNodeBase *)((long)promise.super_PromiseBase.node.ptr + -0x70);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&promise,
               kj::_::
               SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:808:13)>
               ::anon_class_80_6_c22dae31_for_func::operator());
    *(undefined ***)((long)PVar4.super_PromiseBase.node.ptr + -0x70) = &PTR_destroy_006f7410;
    *(unsigned_long **)((long)PVar4.super_PromiseBase.node.ptr + -0x50) = puVar7;
    *(unsigned_long **)((long)PVar4.super_PromiseBase.node.ptr + -0x48) = __dest;
    *(char **)((long)PVar4.super_PromiseBase.node.ptr + -0x40) = _kjCondition.op.content.ptr;
    *(size_t *)((long)PVar4.super_PromiseBase.node.ptr + -0x38) = _kjCondition.op.content.size_;
    *(ulong *)((long)PVar4.super_PromiseBase.node.ptr + -0x10) =
         CONCAT44(uStack_64,in_stack_00000020);
    *(size_t *)((long)PVar4.super_PromiseBase.node.ptr + -8) = fdBuffer;
    *(size_t *)((long)PVar4.super_PromiseBase.node.ptr + -0x20) = sVar8;
    *(undefined8 *)((long)PVar4.super_PromiseBase.node.ptr + -0x18) = uVar3;
    *(undefined8 *)((long)PVar4.super_PromiseBase.node.ptr + -0x30) = _kjCondition._32_8_;
    *(uint64_t *)((long)PVar4.super_PromiseBase.node.ptr + -0x28) = uVar2;
    *(long *)((long)PVar4.super_PromiseBase.node.ptr + -0x68) = lVar1;
  }
  _kjCondition.op.content.ptr = (char *)0x0;
  _kjCondition.right = (unsigned_long *)0x0;
  f.exception = (Exception *)&DAT_005053bd;
  intermediate.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_38,&intermediate,(SourceLocation *)&f);
  node.ptr = intermediate.ptr;
  (this->super_MessageStream)._vptr_MessageStream = local_38;
  if (intermediate.ptr != (PromiseNode *)0x0) {
    intermediate.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  pcVar5 = _kjCondition.op.content.ptr;
  puVar7 = _kjCondition.right;
  if (_kjCondition.right != (unsigned_long *)0x0) {
    _kjCondition.right = (unsigned_long *)0x0;
    _kjCondition.op.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)_kjCondition.op.content.size_)
              (_kjCondition.op.content.size_,puVar7,8,pcVar5,pcVar5,0);
  }
  PVar4.super_PromiseBase.node.ptr = promise.super_PromiseBase.node.ptr;
  if (promise.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
    promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar4.super_PromiseBase.node.ptr);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<MessageReaderAndFds>> BufferedMessageStream::readEntireMessage(
    kj::ArrayPtr<const byte> prefix, size_t expectedSizeInWords,
    kj::ArrayPtr<kj::OwnFd> fdSpace, size_t fdsSoFar,
    ReaderOptions options) {
  KJ_REQUIRE(expectedSizeInWords <= options.traversalLimitInWords,
      "incoming RPC message exceeds size limit");

  auto msgBuffer = kj::heapArray<word>(expectedSizeInWords);

  memcpy(msgBuffer.asBytes().begin(), prefix.begin(), prefix.size());

  size_t bytesRemaining = msgBuffer.asBytes().size() - prefix.size();

  // TODO(perf): If we had scatter-read API support, we could optimistically try to read additional
  //   bytes into the shared buffer, to save syscalls when a big message is immediately followed
  //   by small messages.
  auto promise = tryReadWithFds(
      msgBuffer.asBytes().begin() + prefix.size(), bytesRemaining, bytesRemaining,
      fdSpace.begin() + fdsSoFar, fdSpace.size() - fdsSoFar);
  return promise
      .then([this, msgBuffer = kj::mv(msgBuffer), fdSpace, fdsSoFar, options, bytesRemaining]
            (kj::AsyncCapabilityStream::ReadResult result) mutable
            -> kj::Promise<kj::Maybe<MessageReaderAndFds>> {
    fdsSoFar += result.capCount;

    if (result.byteCount < bytesRemaining) {
      // Received EOF during message.
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "stream disconnected prematurely"));
      return kj::Maybe<MessageReaderAndFds>(kj::none);
    }

    size_t newExpectedSize = expectedSizeInWordsFromPrefix(msgBuffer);
    if (newExpectedSize > msgBuffer.size()) {
      // Unfortunately, the predicted size increased. This can happen if the segment table had
      // not been fully received when we generated the first prediction. This should be rare
      // (most segment tables are small and should be received all at once), but in this case we
      // will need to make a whole new copy of the message.
      //
      // We recurse here, but this should never recurse more than once, since we should always
      // have the entire segment table by this point and therefore the expected size is now final.
      //
      // TODO(perf): Technically it's guaranteed that the original expectation should have stopped
      //   at the boundary between two segments, so with a clever MesnsageReader implementation
      //   we could actually read the rest of the message into a second buffer, avoiding the copy.
      //   Unclear if it's worth the effort to implement this.
      return readEntireMessage(msgBuffer.asBytes(), newExpectedSize, fdSpace, fdsSoFar, options);
    }

    return kj::Maybe<MessageReaderAndFds>(MessageReaderAndFds {
      kj::heap<MessageReaderImpl>(kj::mv(msgBuffer), options),
      fdSpace.first(fdsSoFar)
    });
  });
}